

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O0

int __thiscall dlib::rand::rand(rand *this)

{
  int iVar1;
  EVP_PKEY_CTX *in_RSI;
  long *in_stack_00000158;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  rand *in_stack_ffffffffffffffe0;
  
  this->_vptr_rand = (_func_int **)&PTR__rand_0038d1f0;
  random_helpers::
  mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
  ::mersenne_twister((mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
                      *)0x15190b);
  std::__cxx11::string::string((string *)&this->seed);
  init(this,in_RSI);
  cast_to_string<long>(in_stack_00000158);
  set_seed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar1 = std::__cxx11::string::~string(local_40);
  return iVar1;
}

Assistant:

rand (
                time_t seed_value
            )
            {
                init();
                set_seed(cast_to_string(seed_value));
            }